

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  value_type *pvVar2;
  uint *puVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_219;
  allocator_type local_218;
  allocator<char> local_217;
  allocator<char> local_216;
  allocator<char> local_215;
  allocator<char> local_214;
  allocator<char> local_213;
  allocator<char> local_212;
  allocator<char> local_211;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  string local_1f8;
  plain_bonsai_map<int> map;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&map,"Aoba",(allocator<char> *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             ((long)&map.hash_trie_.table_.chunks_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 0x10),"Yun",&local_219);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&map.hash_trie_.size_,"Hajime",&local_211);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&map.hash_trie_.symb_size_,"Hihumi",&local_212);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &map.label_store_.ptrs_.
              super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Kou",&local_213);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(map.codes_._M_elems + 8),"Rin",&local_214);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(map.codes_._M_elems + 0x28),"Hazuki",&local_215);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(map.codes_._M_elems + 0x48),"Umiko",&local_216);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(map.codes_._M_elems + 0x68),"Nene",&local_217);
  __l._M_len = 9;
  __l._M_array = (iterator)&map;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&keys,__l,&local_218);
  lVar5 = 0x100;
  do {
    std::__cxx11::string::~string((string *)(&map.is_ready_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  map.is_ready_ = false;
  map.lambda_ = 0x20;
  map.hash_trie_.capa_size_.mask_ = 0;
  map.hash_trie_.symb_size_.bits_ = 0;
  map.hash_trie_.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map.hash_trie_.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  map.hash_trie_.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  map.hash_trie_.table_.size_ = 0;
  map.hash_trie_.table_.mask_ = 0;
  map.hash_trie_.table_.width_ = 0;
  map.hash_trie_.size_ = 0;
  map.hash_trie_.max_size_ = 0;
  map.hash_trie_.capa_size_.bits_ = 0;
  map.size_ = 0;
  map.codes_._M_elems[0x90] = '\0';
  map.codes_._M_elems[0x91] = '\0';
  map.codes_._M_elems[0x92] = '\0';
  map.codes_._M_elems[0x93] = '\0';
  map.codes_._M_elems[0x94] = '\0';
  map.codes_._M_elems[0x95] = '\0';
  map.codes_._M_elems[0x96] = '\0';
  map.codes_._M_elems[0x97] = '\0';
  map.codes_._M_elems[0x98] = '\0';
  map.codes_._M_elems[0x99] = '\0';
  map.codes_._M_elems[0x9a] = '\0';
  map.codes_._M_elems[0x9b] = '\0';
  map.codes_._M_elems[0x9c] = '\0';
  map.codes_._M_elems[0x9d] = '\0';
  map.codes_._M_elems[0x9e] = '\0';
  map.codes_._M_elems[0x9f] = '\0';
  map.codes_._M_elems[0xa0] = '\0';
  map.codes_._M_elems[0xa1] = '\0';
  map.codes_._M_elems[0xa2] = '\0';
  map.codes_._M_elems[0xa3] = '\0';
  map.codes_._M_elems[0xa4] = '\0';
  map.codes_._M_elems[0xa5] = '\0';
  map.codes_._M_elems[0xa6] = '\0';
  map.codes_._M_elems[0xa7] = '\0';
  map.codes_._M_elems[0xa8] = '\0';
  map.codes_._M_elems[0xa9] = '\0';
  map.codes_._M_elems[0xaa] = '\0';
  map.codes_._M_elems[0xab] = '\0';
  map.codes_._M_elems[0xac] = '\0';
  map.codes_._M_elems[0xad] = '\0';
  map.codes_._M_elems[0xae] = '\0';
  map.codes_._M_elems[0xaf] = '\0';
  map.codes_._M_elems[0xb0] = '\0';
  map.codes_._M_elems[0xb1] = '\0';
  map.codes_._M_elems[0xb2] = '\0';
  map.codes_._M_elems[0xb3] = '\0';
  map.codes_._M_elems[0xb4] = '\0';
  map.codes_._M_elems[0xb5] = '\0';
  map.codes_._M_elems[0xb6] = '\0';
  map.codes_._M_elems[0xb7] = '\0';
  map.codes_._M_elems[0xb8] = '\0';
  map.codes_._M_elems[0xb9] = '\0';
  map.codes_._M_elems[0xba] = '\0';
  map.codes_._M_elems[0xbb] = '\0';
  map.codes_._M_elems[0xbc] = '\0';
  map.codes_._M_elems[0xbd] = '\0';
  map.codes_._M_elems[0xbe] = '\0';
  map.codes_._M_elems[0xbf] = '\0';
  map.codes_._M_elems[0xc0] = '\0';
  map.codes_._M_elems[0xc1] = '\0';
  map.codes_._M_elems[0xc2] = '\0';
  map.codes_._M_elems[0xc3] = '\0';
  map.hash_trie_.symb_size_.mask_ = 0;
  map.label_store_.ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map.label_store_.ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  map.label_store_.ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  map.label_store_.size_ = 0;
  map.label_store_.label_bytes_ = 0;
  map.codes_._M_elems[0] = '\0';
  map.codes_._M_elems[1] = '\0';
  map.codes_._M_elems[2] = '\0';
  map.codes_._M_elems[3] = '\0';
  map.codes_._M_elems[4] = '\0';
  map.codes_._M_elems[5] = '\0';
  map.codes_._M_elems[6] = '\0';
  map.codes_._M_elems[7] = '\0';
  map.codes_._M_elems[8] = '\0';
  map.codes_._M_elems[9] = '\0';
  map.codes_._M_elems[10] = '\0';
  map.codes_._M_elems[0xb] = '\0';
  map.codes_._M_elems[0xc] = '\0';
  map.codes_._M_elems[0xd] = '\0';
  map.codes_._M_elems[0xe] = '\0';
  map.codes_._M_elems[0xf] = '\0';
  map.codes_._M_elems[0x10] = '\0';
  map.codes_._M_elems[0x11] = '\0';
  map.codes_._M_elems[0x12] = '\0';
  map.codes_._M_elems[0x13] = '\0';
  map.codes_._M_elems[0x14] = '\0';
  map.codes_._M_elems[0x15] = '\0';
  map.codes_._M_elems[0x16] = '\0';
  map.codes_._M_elems[0x17] = '\0';
  map.codes_._M_elems[0x18] = '\0';
  map.codes_._M_elems[0x19] = '\0';
  map.codes_._M_elems[0x1a] = '\0';
  map.codes_._M_elems[0x1b] = '\0';
  map.codes_._M_elems[0x1c] = '\0';
  map.codes_._M_elems[0x1d] = '\0';
  map.codes_._M_elems[0x1e] = '\0';
  map.codes_._M_elems[0x1f] = '\0';
  map.codes_._M_elems[0x20] = '\0';
  map.codes_._M_elems[0x21] = '\0';
  map.codes_._M_elems[0x22] = '\0';
  map.codes_._M_elems[0x23] = '\0';
  map.codes_._M_elems[0x24] = '\0';
  map.codes_._M_elems[0x25] = '\0';
  map.codes_._M_elems[0x26] = '\0';
  map.codes_._M_elems[0x27] = '\0';
  map.codes_._M_elems[0x28] = '\0';
  map.codes_._M_elems[0x29] = '\0';
  map.codes_._M_elems[0x2a] = '\0';
  map.codes_._M_elems[0x2b] = '\0';
  map.codes_._M_elems[0x2c] = '\0';
  map.codes_._M_elems[0x2d] = '\0';
  map.codes_._M_elems[0x2e] = '\0';
  map.codes_._M_elems[0x2f] = '\0';
  map.codes_._M_elems[0x30] = '\0';
  map.codes_._M_elems[0x31] = '\0';
  map.codes_._M_elems[0x32] = '\0';
  map.codes_._M_elems[0x33] = '\0';
  map.codes_._M_elems[0x34] = '\0';
  map.codes_._M_elems[0x35] = '\0';
  map.codes_._M_elems[0x36] = '\0';
  map.codes_._M_elems[0x37] = '\0';
  map.codes_._M_elems[0x38] = '\0';
  map.codes_._M_elems[0x39] = '\0';
  map.codes_._M_elems[0x3a] = '\0';
  map.codes_._M_elems[0x3b] = '\0';
  map.codes_._M_elems[0x3c] = '\0';
  map.codes_._M_elems[0x3d] = '\0';
  map.codes_._M_elems[0x3e] = '\0';
  map.codes_._M_elems[0x3f] = '\0';
  map.codes_._M_elems[0x40] = '\0';
  map.codes_._M_elems[0x41] = '\0';
  map.codes_._M_elems[0x42] = '\0';
  map.codes_._M_elems[0x43] = '\0';
  map.codes_._M_elems[0x44] = '\0';
  map.codes_._M_elems[0x45] = '\0';
  map.codes_._M_elems[0x46] = '\0';
  map.codes_._M_elems[0x47] = '\0';
  map.codes_._M_elems[0x48] = '\0';
  map.codes_._M_elems[0x49] = '\0';
  map.codes_._M_elems[0x4a] = '\0';
  map.codes_._M_elems[0x4b] = '\0';
  map.codes_._M_elems[0x4c] = '\0';
  map.codes_._M_elems[0x4d] = '\0';
  map.codes_._M_elems[0x4e] = '\0';
  map.codes_._M_elems[0x4f] = '\0';
  map.codes_._M_elems[0x50] = '\0';
  map.codes_._M_elems[0x51] = '\0';
  map.codes_._M_elems[0x52] = '\0';
  map.codes_._M_elems[0x53] = '\0';
  map.codes_._M_elems[0x54] = '\0';
  map.codes_._M_elems[0x55] = '\0';
  map.codes_._M_elems[0x56] = '\0';
  map.codes_._M_elems[0x57] = '\0';
  map.codes_._M_elems[0x58] = '\0';
  map.codes_._M_elems[0x59] = '\0';
  map.codes_._M_elems[0x5a] = '\0';
  map.codes_._M_elems[0x5b] = '\0';
  map.codes_._M_elems[0x5c] = '\0';
  map.codes_._M_elems[0x5d] = '\0';
  map.codes_._M_elems[0x5e] = '\0';
  map.codes_._M_elems[0x5f] = '\0';
  map.codes_._M_elems[0x60] = '\0';
  map.codes_._M_elems[0x61] = '\0';
  map.codes_._M_elems[0x62] = '\0';
  map.codes_._M_elems[99] = '\0';
  map.codes_._M_elems[100] = '\0';
  map.codes_._M_elems[0x65] = '\0';
  map.codes_._M_elems[0x66] = '\0';
  map.codes_._M_elems[0x67] = '\0';
  map.codes_._M_elems[0x68] = '\0';
  map.codes_._M_elems[0x69] = '\0';
  map.codes_._M_elems[0x6a] = '\0';
  map.codes_._M_elems[0x6b] = '\0';
  map.codes_._M_elems[0x6c] = '\0';
  map.codes_._M_elems[0x6d] = '\0';
  map.codes_._M_elems[0x6e] = '\0';
  map.codes_._M_elems[0x6f] = '\0';
  map.codes_._M_elems[0x70] = '\0';
  map.codes_._M_elems[0x71] = '\0';
  map.codes_._M_elems[0x72] = '\0';
  map.codes_._M_elems[0x73] = '\0';
  map.codes_._M_elems[0x74] = '\0';
  map.codes_._M_elems[0x75] = '\0';
  map.codes_._M_elems[0x76] = '\0';
  map.codes_._M_elems[0x77] = '\0';
  map.codes_._M_elems[0x78] = '\0';
  map.codes_._M_elems[0x79] = '\0';
  map.codes_._M_elems[0x7a] = '\0';
  map.codes_._M_elems[0x7b] = '\0';
  map.codes_._M_elems[0x7c] = '\0';
  map.codes_._M_elems[0x7d] = '\0';
  map.codes_._M_elems[0x7e] = '\0';
  map.codes_._M_elems[0x7f] = '\0';
  map.codes_._M_elems[0x80] = '\0';
  map.codes_._M_elems[0x81] = '\0';
  map.codes_._M_elems[0x82] = '\0';
  map.codes_._M_elems[0x83] = '\0';
  map.codes_._M_elems[0x84] = '\0';
  map.codes_._M_elems[0x85] = '\0';
  map.codes_._M_elems[0x86] = '\0';
  map.codes_._M_elems[0x87] = '\0';
  map.codes_._M_elems[0x88] = '\0';
  map.codes_._M_elems[0x89] = '\0';
  map.codes_._M_elems[0x8a] = '\0';
  map.codes_._M_elems[0x8b] = '\0';
  map.codes_._M_elems[0x8c] = '\0';
  map.codes_._M_elems[0x8d] = '\0';
  map.codes_._M_elems[0x8e] = '\0';
  map.codes_._M_elems[0x8f] = '\0';
  map.codes_._M_elems[0xc4] = '\0';
  map.codes_._M_elems[0xc5] = '\0';
  map.codes_._M_elems[0xc6] = '\0';
  map.codes_._M_elems[199] = '\0';
  map.codes_._M_elems[200] = '\0';
  map.codes_._M_elems[0xc9] = '\0';
  map.codes_._M_elems[0xca] = '\0';
  map.codes_._M_elems[0xcb] = '\0';
  map.codes_._M_elems[0xcc] = '\0';
  map.codes_._M_elems[0xcd] = '\0';
  map.codes_._M_elems[0xce] = '\0';
  map.codes_._M_elems[0xcf] = '\0';
  map.codes_._M_elems[0xd0] = '\0';
  map.codes_._M_elems[0xd1] = '\0';
  map.codes_._M_elems[0xd2] = '\0';
  map.codes_._M_elems[0xd3] = '\0';
  map.codes_._M_elems[0xd4] = '\0';
  map.codes_._M_elems[0xd5] = '\0';
  map.codes_._M_elems[0xd6] = '\0';
  map.codes_._M_elems[0xd7] = '\0';
  map.codes_._M_elems[0xd8] = '\0';
  map.codes_._M_elems[0xd9] = '\0';
  map.codes_._M_elems[0xda] = '\0';
  map.codes_._M_elems[0xdb] = '\0';
  map.codes_._M_elems[0xdc] = '\0';
  map.codes_._M_elems[0xdd] = '\0';
  map.codes_._M_elems[0xde] = '\0';
  map.codes_._M_elems[0xdf] = '\0';
  map.codes_._M_elems[0xe0] = '\0';
  map.codes_._M_elems[0xe1] = '\0';
  map.codes_._M_elems[0xe2] = '\0';
  map.codes_._M_elems[0xe3] = '\0';
  map.codes_._M_elems[0xe4] = '\0';
  map.codes_._M_elems[0xe5] = '\0';
  map.codes_._M_elems[0xe6] = '\0';
  map.codes_._M_elems[0xe7] = '\0';
  map.codes_._M_elems[0xe8] = '\0';
  map.codes_._M_elems[0xe9] = '\0';
  map.codes_._M_elems[0xea] = '\0';
  map.codes_._M_elems[0xeb] = '\0';
  map.codes_._M_elems[0xec] = '\0';
  map.codes_._M_elems[0xed] = '\0';
  map.codes_._M_elems[0xee] = '\0';
  map.codes_._M_elems[0xef] = '\0';
  map.codes_._M_elems[0xf0] = '\0';
  map.codes_._M_elems[0xf1] = '\0';
  map.codes_._M_elems[0xf2] = '\0';
  map.codes_._M_elems[0xf3] = '\0';
  map.codes_._M_elems[0xf4] = '\0';
  map.codes_._M_elems[0xf5] = '\0';
  map.codes_._M_elems[0xf6] = '\0';
  map.codes_._M_elems[0xf7] = '\0';
  map.codes_._M_elems[0xf8] = '\0';
  map.codes_._M_elems[0xf9] = '\0';
  map.codes_._M_elems[0xfa] = '\0';
  map.codes_._M_elems[0xfb] = '\0';
  map.codes_._M_elems[0xfc] = '\0';
  map.codes_._M_elems[0xfd] = '\0';
  map.codes_._M_elems[0xfe] = '\0';
  map.codes_._M_elems[0xff] = '\0';
  map.num_codes_ = 0;
  uVar1 = (uint)((ulong)((long)keys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)keys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  uVar6 = (ulong)(~((int)uVar1 >> 0x1f) & uVar1);
  iVar7 = 1;
  for (lVar5 = 0; uVar6 << 5 != lVar5; lVar5 = lVar5 + 0x20) {
    pvVar2 = poplar::
             map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
             ::update(&map,(string *)
                           ((long)&((keys.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar5));
    *pvVar2 = iVar7;
    iVar7 = iVar7 + 1;
  }
  lVar5 = 0;
  uVar8 = 0;
  do {
    if (uVar6 == uVar8) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Hotaru",&local_219);
      pvVar2 = poplar::
               map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
               ::find(&map,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      iVar7 = 1;
      if (pvVar2 == (value_type *)0x0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Hotaru: ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,-1);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"#keys = ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        iVar7 = 0;
        std::endl<char,std::char_traits<char>>(poVar4);
      }
LAB_001046fc:
      poplar::
      map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
      ::~map(&map);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&keys);
      return iVar7;
    }
    puVar3 = (uint *)poplar::
                     map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                     ::find(&map,(string *)
                                 ((long)&((keys.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar5));
    if ((puVar3 == (uint *)0x0) || (uVar8 = uVar8 + 1, uVar8 != *puVar3)) {
      iVar7 = 1;
      goto LAB_001046fc;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             ((long)&((keys.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar5));
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*puVar3);
    lVar5 = lVar5 + 0x20;
    std::endl<char,std::char_traits<char>>(poVar4);
  } while( true );
}

Assistant:

int main() {
    std::vector<std::string> keys = {"Aoba", "Yun", "Hajime", "Hihumi", "Kou", "Rin", "Hazuki", "Umiko", "Nene"};
    const auto num_keys = static_cast<int>(keys.size());

    poplar::plain_bonsai_map<int> map;

    try {
        for (int i = 0; i < num_keys; ++i) {
            int* ptr = map.update(keys[i]);
            *ptr = i + 1;
        }
        for (int i = 0; i < num_keys; ++i) {
            const int* ptr = map.find(keys[i]);
            if (ptr == nullptr or *ptr != i + 1) {
                return 1;
            }
            std::cout << keys[i] << ": " << *ptr << std::endl;
        }
        {
            const int* ptr = map.find("Hotaru");
            if (ptr != nullptr) {
                return 1;
            }
            std::cout << "Hotaru: " << -1 << std::endl;
        }
    } catch (const poplar::exception& ex) {
        std::cerr << ex.what() << std::endl;
        return 1;
    }

    std::cout << "#keys = " << map.size() << std::endl;

    return 0;
}